

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdpfor.h
# Opt level: O2

uint32_t __thiscall
FastPForLib::SIMDPFor::compressblockPFOR
          (SIMDPFor *this,DATATYPE *in,uint32_t *outputbegin,uint32_t b,DATATYPE **exceptions)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  size_t k;
  long lVar5;
  uint *puVar6;
  ulong uVar7;
  uint *puVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint local_38;
  
  if (b == 0x20) {
    for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 1) {
      outputbegin[lVar5] = in[lVar5];
    }
    return 0x80;
  }
  uVar9 = 1;
  puVar4 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = 1 << (b & 0x1f);
  uVar12 = 0;
  for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 1) {
    puVar4[uVar12] = (uint)lVar5;
    uVar12 = (uVar12 + 1) - (ulong)(in[lVar5] < uVar10);
  }
  if (uVar12 == 0) {
    local_38 = 0x80;
  }
  else {
    pvVar1 = &this->codedcopy;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)pvVar1,in,in + 0x80);
    local_38 = *(this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start;
    uVar7 = (ulong)local_38;
    puVar8 = *exceptions;
    uVar2 = (this->codedcopy).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar7];
    puVar6 = puVar8 + 1;
    *exceptions = puVar6;
    *puVar8 = uVar2;
    if (b < 7) {
      for (uVar9 = 1; uVar9 < uVar12; uVar9 = (ulong)((int)uVar9 + 1)) {
        uVar2 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[uVar9];
        puVar8 = puVar6;
        while( true ) {
          puVar6 = puVar8 + 1;
          puVar4 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          uVar11 = (uint)uVar7 + uVar10;
          if (uVar2 <= uVar11) break;
          uVar3 = puVar4[uVar11];
          *exceptions = puVar6;
          *puVar8 = uVar3;
          (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar7] = uVar10 - 1;
          uVar7 = (ulong)uVar11;
          puVar8 = puVar6;
        }
        uVar11 = puVar4[uVar2];
        *exceptions = puVar6;
        *puVar8 = uVar11;
        (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar7] = ~(uint)uVar7 + uVar2;
        uVar7 = (ulong)uVar2;
      }
    }
    else {
      puVar8 = puVar8 + 2;
      for (; uVar9 < uVar12; uVar9 = (ulong)((int)uVar9 + 1)) {
        uVar10 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar9];
        uVar2 = (this->codedcopy).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar10];
        *exceptions = puVar8;
        puVar8[-1] = uVar2;
        puVar8 = puVar8 + 1;
        (this->codedcopy).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] = ~(uint)uVar7 + uVar10;
        uVar7 = (ulong)uVar10;
      }
    }
    in = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start;
  }
  usimdpack(in,(__m128i *)outputbegin,b);
  return local_38;
}

Assistant:

uint32_t compressblockPFOR(const DATATYPE *__restrict__ in,
                             uint32_t *__restrict__ outputbegin,
                             const uint32_t b,
                             DATATYPE *__restrict__ &exceptions) {
    if (b == 32) {
      for (size_t k = 0; k < BlockSize; ++k)
        *(outputbegin++) = *(in++);
      return BlockSize;
    }
    size_t exceptcounter = 0;
    const uint32_t maxgap = 1U << b;
    {
      std::vector<uint32_t>::iterator cci = codedcopy.begin();
      for (uint32_t k = 0; k < BlockSize; ++k, ++cci) {
        miss[exceptcounter] = k;
        exceptcounter += (in[k] >= maxgap);
      }
    }
    if (exceptcounter == 0) {
      packblock(in, outputbegin, b);
      return BlockSize;
    }
    codedcopy.assign(in, in + BlockSize);
    uint32_t firstexcept = miss[0];
    uint32_t prev = 0;
    *(exceptions++) = codedcopy[firstexcept];
    prev = firstexcept;
    if (maxgap < BlockSize) {
      for (uint32_t i = 1; i < exceptcounter; ++i) {
        uint32_t cur = miss[i];
        // they don't include this part, but it is required:
        while (cur > maxgap + prev) {
          // compulsory exception
          uint32_t compulcur = prev + maxgap;
          *(exceptions++) = codedcopy[compulcur];
          codedcopy[prev] = maxgap - 1;
          prev = compulcur;
        }
        *(exceptions++) = codedcopy[cur];
        codedcopy[prev] = cur - prev - 1;
        prev = cur;
      }
    } else {
      for (uint32_t i = 1; i < exceptcounter; ++i) {
        uint32_t cur = miss[i];
        *(exceptions++) = codedcopy[cur];
        codedcopy[prev] = cur - prev - 1;
        prev = cur;
      }
    }
    packblock(&codedcopy[0], outputbegin, b);
    return firstexcept;
  }